

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O1

int Abc_FlowRetime_PartialSat(Vec_Ptr_t *vNodes,int cut)

{
  uint uVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *pFanin;
  long *plVar3;
  int iVar4;
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  long lVar7;
  long lVar8;
  
  pAVar2 = pManMR->pInitNtk;
  if (pAVar2->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum( pInitNtk ) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x3c1,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
  }
  pNtkNew = Abc_NtkAlloc(pAVar2->ntkType,pAVar2->ntkFunc,0);
  if (0 < vNodes->nSize) {
    lVar8 = 0;
    do {
      pAVar6 = (Abc_Obj_t *)vNodes->pArray[lVar8];
      uVar1 = *(uint *)&pAVar6->field_0x14;
      *(uint *)&pAVar6->field_0x14 = uVar1 & 0xfff | (int)lVar8 << 0xc;
      if ((uVar1 & 0xf) == 3) {
        __assert_fail("!Abc_ObjIsPo( pObj )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x3c8,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
      }
      if ((lVar8 < cut) && ((uVar1 & 0x10) == 0)) {
        pAVar5 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_PI);
        (pAVar6->field_6).pCopy = pAVar5;
      }
      else {
        pAVar5 = Abc_NtkDupObj(pNtkNew,pAVar6,0);
        *(uint *)&pAVar5->field_0x14 =
             *(uint *)&pAVar5->field_0x14 & 0xffffff7f | *(uint *)&pAVar6->field_0x14 & 0x80;
        if (0 < (pAVar6->vFanins).nSize) {
          lVar7 = 0;
          do {
            pFanin = *(Abc_Obj_t **)
                      ((long)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar7]] + 0x40);
            if (pFanin == (Abc_Obj_t *)0x0) {
              __assert_fail("pPartNext",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                            ,0x3d6,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
            }
            Abc_ObjAddFanin(pAVar5,pFanin);
            lVar7 = lVar7 + 1;
          } while (lVar7 < (pAVar6->vFanins).nSize);
        }
      }
      if ((Abc_Obj_t *)(pAVar6->field_6).pTemp != pAVar5) {
        __assert_fail("pObj->pCopy == pPartObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x3db,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vNodes->nSize);
  }
  pAVar6 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_PO);
  if (pAVar2->vPos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  plVar3 = (long *)*pAVar2->vPos->pArray;
  pAVar5 = *(Abc_Obj_t **)
            (*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8) +
            0x40);
  if (pAVar5 == (Abc_Obj_t *)0x0) {
    __assert_fail("pPartNext",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x3e2,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
  }
  Abc_ObjAddFanin(pAVar6,pAVar5);
  Abc_NtkAddDummyPoNames(pNtkNew);
  Abc_NtkAddDummyPiNames(pNtkNew);
  Abc_NtkCheck(pNtkNew);
  iVar4 = Abc_NtkMiterSat(pNtkNew,500000,50000000,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
  Abc_NtkDelete(pNtkNew);
  return (int)(iVar4 == 0);
}

Assistant:

int Abc_FlowRetime_PartialSat(Vec_Ptr_t *vNodes, int cut) {
  Abc_Ntk_t *pPartNtk, *pInitNtk = pManMR->pInitNtk;
  Abc_Obj_t *pObj, *pNext, *pPartObj, *pPartNext, *pPo;
  int i, j, result;

  assert( Abc_NtkPoNum( pInitNtk ) == 1 );

  pPartNtk = Abc_NtkAlloc( pInitNtk->ntkType, pInitNtk->ntkFunc, 0 );

  // copy network
  Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i ) {
    pObj->Level = i;
    assert(!Abc_ObjIsPo( pObj ));

    if (i < cut && !pObj->fMarkA) {
      pPartObj = Abc_NtkCreatePi( pPartNtk );
      Abc_ObjSetCopy( pObj, pPartObj );
    } else {
      // copy node
      pPartObj = Abc_NtkDupObj( pPartNtk, pObj, 0 );
      // copy complementation
      pPartObj->fPhase = pObj->fPhase;
   
      // connect fanins
      Abc_ObjForEachFanin( pObj, pNext, j ) {   
        pPartNext = Abc_ObjCopy( pNext );
        assert(pPartNext);
        Abc_ObjAddFanin( pPartObj, pPartNext );
      }
    }

    assert(pObj->pCopy == pPartObj);
  }
  
  // create PO
  pPo = Abc_NtkCreatePo( pPartNtk );
  pNext = Abc_ObjFanin0( Abc_NtkPo( pInitNtk, 0 ) );
  pPartNext = Abc_ObjCopy( pNext );
  assert( pPartNext );
  Abc_ObjAddFanin( pPo, pPartNext );
  
  // check network
#if defined(DEBUG_CHECK)
  Abc_NtkAddDummyPoNames(pPartNtk);
  Abc_NtkAddDummyPiNames(pPartNtk);
  Abc_NtkCheck( pPartNtk );
#endif

  result = Abc_NtkMiterSat( pPartNtk, (ABC_INT64_T)500000, (ABC_INT64_T)50000000, 0, NULL, NULL );

  Abc_NtkDelete( pPartNtk );
 
  return !result;
}